

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void google::protobuf::internal::ExtensionSet::RegisterMessageExtension
               (MessageLite *extendee,int number,FieldType type,bool is_repeated,bool is_packed,
               MessageLite *prototype,LazyEagerVerifyFnType verify_func,LazyAnnotation is_lazy)

{
  uint uVar1;
  ExtensionInfo *this;
  KeyValue *pKVar2;
  KeyValue *pKVar3;
  long lVar4;
  long lVar5;
  KeyValue *pKVar6;
  bool bVar7;
  iterator iVar8;
  iterator iVar9;
  ExtensionInfo local_40;
  
  if ((type & 0xfe) == 10) {
    local_40.is_lazy = is_lazy;
    local_40.field_6.enum_validity_check.func = (EnumValidityFuncWithArg *)0x0;
    local_40.field_6.enum_validity_check.arg = (void *)0x0;
    local_40.descriptor = (FieldDescriptor *)0x0;
    local_40.lazy_eager_verify_func = verify_func;
    local_40.message = extendee;
    local_40.number = number;
    local_40.type = type;
    local_40.is_repeated = is_repeated;
    local_40.is_packed = is_packed;
    local_40.field_6.message_info.tc_table = MessageLite::GetTcParseTable(prototype);
    local_40.field_6.message_info.prototype = prototype;
    anon_unknown_58::Register(&local_40);
    return;
  }
  this = &local_40;
  RegisterMessageExtension((ExtensionSet *)this);
  if (this->message == (MessageLite *)0x0) {
    lVar4 = (long)(short)*(uint16_t *)((long)&this->number + 2);
    pKVar3 = (KeyValue *)(this->field_6).message_info.prototype;
    if (lVar4 < 0) {
      iVar8 = absl::lts_20240722::container_internal::
              btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
              ::begin((btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                       *)pKVar3);
      iVar9 = absl::lts_20240722::container_internal::
              btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
              ::end((btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                     *)((AllocatedData *)&(this->field_6).message_info.prototype)->flat);
      ForEachPrefetchImpl<absl::lts_20240722::container_internal::btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>&,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>*>,google::protobuf::internal::ExtensionSet::~btree_iterator()::__0,google::protobuf::internal::ExtensionSet::PrefetchNta>
                (iVar8.node_,iVar8.position_,iVar9.node_,iVar9._8_8_ & 0xffffffff);
    }
    else {
      lVar5 = lVar4 * 0x20;
      pKVar2 = pKVar3;
      if (*(uint16_t *)((long)&this->number + 2) != 0) {
        uVar1 = 0;
        do {
          lVar5 = lVar5 + -0x20;
          Extension::PrefetchPtr(&pKVar2->second);
          pKVar2 = pKVar2 + 1;
          if (lVar5 == 0) break;
          bVar7 = uVar1 < 0xf;
          uVar1 = uVar1 + 1;
        } while (bVar7);
      }
      pKVar6 = pKVar3 + lVar4;
      for (; pKVar2 != pKVar6; pKVar2 = pKVar2 + 1) {
        Extension::Free(&pKVar3->second);
        Extension::PrefetchPtr(&pKVar2->second);
        pKVar3 = pKVar3 + 1;
      }
      for (; pKVar3 != pKVar6; pKVar3 = pKVar3 + 1) {
        Extension::Free(&pKVar3->second);
      }
    }
    pKVar3 = ((AllocatedData *)&(this->field_6).message_info.prototype)->flat;
    if (-1 < (short)*(uint16_t *)((long)&this->number + 2)) {
      operator_delete__(pKVar3,(ulong)*(ushort *)&this->number << 5);
      return;
    }
    ~ExtensionSet((ExtensionSet *)pKVar3);
  }
  return;
}

Assistant:

void ExtensionSet::RegisterMessageExtension(const MessageLite* extendee,
                                            int number, FieldType type,
                                            bool is_repeated, bool is_packed,
                                            const MessageLite* prototype,
                                            LazyEagerVerifyFnType verify_func,
                                            LazyAnnotation is_lazy) {
  ABSL_CHECK(type == WireFormatLite::TYPE_MESSAGE ||
             type == WireFormatLite::TYPE_GROUP);
  ExtensionInfo info(extendee, number, type, is_repeated, is_packed,
                     verify_func, is_lazy);
  info.message_info = {prototype,
#if defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)
                       prototype->GetTcParseTable()
#else
                       nullptr
#endif
  }